

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

char * optimal_encoding_export(_encode_match_data *emd)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  puVar1 = *(undefined8 **)((long)emd->priv + 0x28);
  export_helper(*(interval_nodep *)((long)emd->priv + 0x30),0x10);
  pcVar4 = stpcpy(optimal_encoding_export::buf,export_helper::buf);
  pcVar4 = optimal_encoding_export::buf + ((int)pcVar4 + -0x169440);
  export_helper((interval_nodep)*puVar1,4);
  iVar2 = sprintf(pcVar4,",%s",export_helper::buf);
  export_helper((interval_nodep)puVar1[1],0x10);
  iVar3 = sprintf(pcVar4 + iVar2,",%s",export_helper::buf);
  export_helper((interval_nodep)puVar1[7],0x10);
  sprintf(pcVar4 + iVar2 + iVar3,",%s",export_helper::buf);
  return optimal_encoding_export::buf;
}

Assistant:

const char *optimal_encoding_export(encode_match_data emd)
{
    interval_nodep *offsets;
    static char buf[100];
    char *p = buf;
    encode_match_privp data;
    data = emd->priv;
    offsets = (interval_nodep*)data->offset_f_priv;
    p += sprintf(p, "%s", export_helper((interval_nodep)data->len_f_priv, 16));
    p += sprintf(p, ",%s", export_helper(offsets[0], 4));
    p += sprintf(p, ",%s", export_helper(offsets[1], 16));
    p += sprintf(p, ",%s", export_helper(offsets[7], 16));
    return buf;
}